

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O3

void __thiscall cali::Caliper::end_with_value_check(Caliper *this,Attribute *attr,Variant *data)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  ThreadData *pTVar1;
  ulong uVar2;
  GlobalData *pGVar3;
  long *plVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  _Bool _Var6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  cali_id_t cVar10;
  ostream *poVar11;
  Node *pNVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  ulong uVar14;
  cali_id_t cVar15;
  uint uVar16;
  ulong uVar17;
  anon_union_8_7_33918203_for_value aVar18;
  Channel *channel;
  long *plVar19;
  mutex *__mutex;
  undefined1 auVar20 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  pthread_mutex_t *__mutex_00;
  Blackboard *this_01;
  cali_variant_t lhs;
  cali_variant_t rhs;
  string error;
  Entry merged_entry;
  char local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d8;
  ulong local_2d0;
  undefined1 local_2b8 [32];
  ulong local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_290;
  Attribute local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_280;
  string local_278;
  string local_258;
  undefined1 local_238 [8];
  anon_union_8_7_33918203_for_value aStack_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228 [14];
  ios_base local_140 [264];
  int local_38;
  
  if (this->sT->stack_error != false) {
    return;
  }
  uVar7 = Attribute::properties(attr);
  uVar16 = uVar7 & 0x3c;
  if (attr->m_node == (Node *)0x0) {
    local_2d0 = 0xffffffffffffffff;
  }
  else {
    local_2d0 = attr->m_node->m_id;
  }
  local_298 = (ulong)((uVar7 >> 10 & 1) != 0) + 1;
  uVar17 = local_2d0;
  if ((uVar7 & 1) == 0) {
    uVar17 = local_298;
  }
  pTVar1 = this->sT;
  (pTVar1->lock).m_lock = (pTVar1->lock).m_lock + 1;
  uVar14 = uVar17;
  local_290 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)this;
  if (uVar16 == 0x14) {
    do {
      uVar9 = (ulong)(uint)(((int)uVar14 + (int)(uVar14 / 0x3fd) * -0x3fd) * 0x20);
      uVar2 = *(ulong *)((long)&(pTVar1->thread_blackboard).hashtable[0].key + uVar9);
      if (uVar2 == uVar17) break;
      uVar14 = uVar14 % 0x3fd + 1;
    } while (uVar2 != 0xffffffffffffffff);
    if (uVar2 == uVar17) {
      local_228[0]._0_8_ =
           *(anon_union_8_7_33918203_for_value *)
            ((long)&(pTVar1->thread_blackboard).hashtable[0].value.m_value.m_v.value + uVar9);
      local_238 = *(undefined1 (*) [8])
                   ((long)&(pTVar1->thread_blackboard).hashtable[0].value.m_node + uVar9);
      aStack_230 = *(anon_union_8_7_33918203_for_value *)
                    ((long)&(pTVar1->thread_blackboard).hashtable[0].value.m_value.m_v.type_and_size
                    + uVar9);
    }
    else {
      local_238 = (undefined1  [8])0x0;
      aStack_230.v_uint = 0;
      local_228[0]._M_allocated_capacity = 0;
    }
    Entry::get((Entry *)local_2b8,(Entry *)local_238,attr);
    cVar10 = 0xffffffffffffffff;
    cVar15 = 0xffffffffffffffff;
    if ((local_238 != (undefined1  [8])0x0) &&
       (cVar15 = *(cali_id_t *)((long)local_238 + 0x30), cVar15 == 8)) {
      cVar15 = *(cali_id_t *)((long)local_238 + 0x10);
    }
    if (attr->m_node != (Node *)0x0) {
      cVar10 = attr->m_node->m_id;
    }
    if (cVar15 == cVar10) {
LAB_001dfcd8:
      local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238;
      aVar18.v_uint._1_7_ = local_2b8._17_7_;
      aVar18.v_bool = (bool)local_2b8[0x10];
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._0_8_;
      paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._8_8_;
    }
    else {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._0_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        auVar20 = (undefined1  [8])0x0;
      }
      else {
        auVar20 = local_238;
        if (uVar17 == 2) goto LAB_001dfcd8;
      }
      aVar18.v_uint = 0;
      anon_unknown.dwarf_408129::log_stack_error((Node *)auVar20,attr);
      paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
      local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
    }
  }
  else {
    if (uVar16 != 0xc) goto LAB_001e0129;
    __mutex = &this->sG->process_blackboard_lock;
    iVar8 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar8 != 0) {
      std::__throw_system_error(iVar8);
    }
    pGVar3 = this->sG;
    do {
      uVar9 = (ulong)(uint)(((int)uVar14 + (int)(uVar14 / 0x3fd) * -0x3fd) * 0x20);
      uVar2 = *(ulong *)((long)&(pGVar3->process_blackboard).hashtable[0].key + uVar9);
      if (uVar2 == uVar17) break;
      uVar14 = uVar14 % 0x3fd + 1;
    } while (uVar2 != 0xffffffffffffffff);
    if (uVar2 == uVar17) {
      local_228[0]._0_8_ =
           *(anon_union_8_7_33918203_for_value *)
            ((long)&(pGVar3->process_blackboard).hashtable[0].value.m_value.m_v.value + uVar9);
      local_238 = *(undefined1 (*) [8])
                   ((long)&(pGVar3->process_blackboard).hashtable[0].value.m_node + uVar9);
      aStack_230 = *(anon_union_8_7_33918203_for_value *)
                    ((long)&(pGVar3->process_blackboard).hashtable[0].value.m_value.m_v.
                            type_and_size + uVar9);
    }
    else {
      local_238 = (undefined1  [8])0x0;
      aStack_230.v_uint = 0;
      local_228[0]._M_allocated_capacity = 0;
    }
    Entry::get((Entry *)local_2b8,(Entry *)local_238,attr);
    cVar10 = 0xffffffffffffffff;
    cVar15 = 0xffffffffffffffff;
    if ((local_238 != (undefined1  [8])0x0) &&
       (cVar15 = *(cali_id_t *)((long)local_238 + 0x30), cVar15 == 8)) {
      cVar15 = *(cali_id_t *)((long)local_238 + 0x10);
    }
    if (attr->m_node != (Node *)0x0) {
      cVar10 = attr->m_node->m_id;
    }
    if (cVar15 == cVar10) {
LAB_001dfd63:
      local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238;
      aVar18.v_uint._1_7_ = local_2b8._17_7_;
      aVar18.v_bool = (bool)local_2b8[0x10];
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._0_8_;
      paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._8_8_;
    }
    else {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._0_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        auVar20 = (undefined1  [8])0x0;
      }
      else {
        auVar20 = local_238;
        if (uVar17 == 2) goto LAB_001dfd63;
      }
      paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
      anon_unknown.dwarf_408129::log_stack_error((Node *)auVar20,attr);
      aVar18.v_uint = 0;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
      local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  if (paVar13 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    local_288 = (Attribute)attr->m_node;
    local_2b8._0_8_ = local_2b8 + 0x10;
    local_2b8._8_8_ = 0;
    local_2b8[0x10] = false;
    std::__cxx11::string::_M_replace((ulong)local_2b8,0,(char *)0x0,0x22b9c6);
  }
  else {
    if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(data->m_v).type_and_size == paVar21) &&
       (lhs.value.v_uint = (data->m_v).value.v_uint, lhs.type_and_size = (uint64_t)paVar21,
       rhs.value.v_uint = aVar18.v_uint, rhs.type_and_size = (uint64_t)paVar21,
       _Var6 = _cali_variant_value_eq(lhs,rhs), paVar5 = local_290, _Var6)) {
      local_280 = paVar13;
      if ((uVar7 & 0x40) == 0) {
        plVar4 = *(long **)(*(long *)((long)local_290 + 8) + 0x8120);
        for (plVar19 = *(long **)(*(long *)((long)local_290 + 8) + 0x8118); plVar19 != plVar4;
            plVar19 = plVar19 + 2) {
          local_278._M_dataplus._M_p = (pointer)*plVar19;
          local_2b8._0_8_ = paVar5;
          local_238 = (undefined1  [8])paVar21;
          aStack_230 = aVar18;
          util::
          callback<void(cali::Caliper*,cali::ChannelBody*,cali::Attribute_const&,cali::Variant_const&)>
          ::operator()((callback<void(cali::Caliper*,cali::ChannelBody*,cali::Attribute_const&,cali::Variant_const&)>
                        *)(local_278._M_dataplus._M_p + 0xa0),(Caliper **)local_2b8,
                       (ChannelBody **)&local_278,attr,(Variant *)local_238);
        }
      }
      local_2e0 = (char)uVar7;
      if (uVar16 == 0x14) {
        this_00 = &(*(MetadataTree **)(paVar5->_M_local_buf + 0x10))[0x5c].m_mempool.mP.
                   super___shared_ptr<cali::MemoryPool::MemoryPoolImpl,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
        if ((uVar7 & 1) == 0) {
          pNVar12 = *(Node **)(local_2d8->_M_allocated_capacity + *(long *)((long)local_2d8 + 8));
          if (pNVar12 != (Node *)((long)internal::MetadataTree::mG._M_b._M_p + 0x10)) {
            if (local_2d8 != local_280) {
              pNVar12 = internal::MetadataTree::remove_first_in_path
                                  (*(MetadataTree **)(paVar5->_M_local_buf + 0x10),(Node *)local_2d8
                                   ,attr);
            }
            aStack_230 = (anon_union_8_7_33918203_for_value)(pNVar12->m_data).m_v.type_and_size;
            local_228[0]._0_8_ = (pNVar12->m_data).m_v.value;
            local_238 = (undefined1  [8])pNVar12;
            Blackboard::set((Blackboard *)this_00,local_298,(Entry *)local_238,-1 < local_2e0);
            goto LAB_001e0129;
          }
          local_2d0 = local_298;
        }
        Blackboard::del((Blackboard *)this_00,local_2d0);
        goto LAB_001e0129;
      }
      __mutex_00 = (pthread_mutex_t *)(*(long *)((long)paVar5 + 8) + 0x80d8);
      iVar8 = pthread_mutex_lock(__mutex_00);
      if (iVar8 != 0) {
        std::__throw_system_error(iVar8);
      }
      this_01 = (Blackboard *)(*(long *)((long)paVar5 + 8) + 0x90);
      if ((uVar7 & 1) == 0) {
        paVar13 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    **)(local_2d8->_M_allocated_capacity + *(long *)((long)local_2d8 + 8));
        if (paVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)internal::MetadataTree::mG._M_b._M_p + 0x10)) {
          local_2d0 = local_298;
          goto LAB_001e0287;
        }
        if (local_2d8 != local_280) {
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)internal::MetadataTree::remove_first_in_path
                                 (*(MetadataTree **)(paVar5->_M_local_buf + 0x10),(Node *)local_2d8,
                                  attr);
        }
        aStack_230 = (anon_union_8_7_33918203_for_value)
                     (((Variant *)(paVar13->_M_local_buf + 0x38))->m_v).type_and_size;
        local_228[0]._0_8_ = *(anon_union_8_7_33918203_for_value *)(paVar13->_M_local_buf + 0x40);
        local_238 = (undefined1  [8])paVar13;
        Blackboard::set(this_01,local_298,(Entry *)local_238,-1 < local_2e0);
      }
      else {
LAB_001e0287:
        Blackboard::del(this_01,local_2d0);
      }
      pthread_mutex_unlock(__mutex_00);
      goto LAB_001e0129;
    }
    local_288 = (Attribute)attr->m_node;
    local_2b8._0_8_ = local_2b8 + 0x10;
    local_2b8._8_8_ = 0;
    local_2b8[0x10] = false;
    std::__cxx11::string::_M_replace((ulong)local_2b8,0,(char *)0x0,0x22b9d5);
    Attribute::name_abi_cxx11_((string *)local_238,&local_288);
    std::__cxx11::string::_M_append(local_2b8,(ulong)local_238);
    if (local_238 != (undefined1  [8])local_228) {
      operator_delete((void *)local_238,local_228[0]._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append(local_2b8);
    local_278._M_dataplus._M_p = (pointer)paVar21;
    local_278._M_string_length = (size_type)aVar18;
    Variant::to_string_abi_cxx11_((string *)local_238,(Variant *)&local_278);
    std::__cxx11::string::_M_append(local_2b8,(ulong)local_238);
    if (local_238 != (undefined1  [8])local_228) {
      operator_delete((void *)local_238,local_228[0]._M_allocated_capacity + 1);
    }
  }
  poVar11 = (ostream *)local_238;
  std::ofstream::ofstream(poVar11);
  local_38 = 0;
  iVar8 = Log::verbosity();
  if (local_38 <= iVar8) {
    poVar11 = Log::get_stream((Log *)local_238);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,"Stack value mismatch: Trying to end ",0x24);
  Attribute::name_abi_cxx11_(&local_278,&local_288);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,local_278._M_dataplus._M_p,local_278._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"=",1);
  Variant::to_string_abi_cxx11_(&local_258,data);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,local_258._M_dataplus._M_p,local_258._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11," but ",5);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,(char *)local_2b8._0_8_,local_2b8._8_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  local_238 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_238 + _VTT[-1].m_attribute) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf((filebuf *)&aStack_230.v_bool);
  std::ios_base::~ios_base(local_140);
  if ((Node *)local_2b8._0_8_ != (Node *)(local_2b8 + 0x10)) {
    operator_delete((void *)local_2b8._0_8_,CONCAT71(local_2b8._17_7_,local_2b8[0x10]) + 1);
  }
  *(undefined1 *)(*(long *)(local_290->_M_local_buf + 0x10) + 0x9735) = 1;
LAB_001e0129:
  (pTVar1->lock).m_lock = (pTVar1->lock).m_lock + -1;
  return;
}

Assistant:

void Caliper::end_with_value_check(const Attribute& attr, const Variant& data)
{
    if (sT->stack_error)
        return;

    int prop  = attr.properties();
    int scope = prop & CALI_ATTR_SCOPE_MASK;

    bool run_events = !(prop & CALI_ATTR_SKIP_EVENTS);

    cali_id_t key = get_blackboard_key(attr.id(), prop);
    BlackboardEntry current = { Entry(), Entry( ) };

    std::lock_guard<::siglock> g(sT->lock);

    if (scope == CALI_ATTR_SCOPE_THREAD)
        current = load_current_entry(attr, key, sT->thread_blackboard);
    else if (scope == CALI_ATTR_SCOPE_PROCESS) {
        std::lock_guard<std::mutex> gbb(sG->process_blackboard_lock);
        current = load_current_entry(attr, key, sG->process_blackboard);
    } else
        return;

    if (current.entry.empty() || data != current.entry.value()) {
        log_stack_value_error(current.entry, attr, data);
        sT->stack_error = true;
        return;
    }

    // invoke callbacks
    if (run_events)
        for (auto& channel : sG->active_channels)
            channel.mP->events.pre_end_evt(this, channel.body(), attr, current.entry.value());

    if (scope == CALI_ATTR_SCOPE_THREAD)
        handle_end(attr, prop, current, key, sT->thread_blackboard, sT->tree);
    else {
        std::lock_guard<std::mutex> gbb(sG->process_blackboard_lock);
        handle_end(attr, prop, current, key, sG->process_blackboard, sT->tree);
    }
}